

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanPartialInternal<unsigned_char,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_t dVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  RLEScanState<unsigned_char> *scan_state;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong uVar6;
  rle_count_t *index_pointer;
  ulong uVar7;
  
  scan_state = (RLEScanState<unsigned_char> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  pdVar4 = BufferHandle::Ptr(&scan_state->handle);
  iVar2 = segment->offset;
  index_pointer = (rle_count_t *)(pdVar4 + scan_state->rle_count_offset + iVar2);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<unsigned_char>(scan_state,index_pointer,pdVar4 + iVar2 + 8,0x800,result);
    return;
  }
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar7 = scan_count + result_offset;
  while( true ) {
    uVar6 = uVar7 - result_offset;
    if (uVar7 < result_offset || uVar6 == 0) {
      return;
    }
    uVar5 = (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry;
    dVar1 = (pdVar4 + iVar2 + 8)[scan_state->entry_pos];
    if (uVar6 < uVar5) break;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pdVar3[uVar6 + result_offset] = dVar1;
    }
    scan_state->entry_pos = scan_state->entry_pos + 1;
    result_offset = result_offset + uVar5;
    scan_state->position_in_entry = 0;
  }
  for (; uVar7 != result_offset; result_offset = result_offset + 1) {
    pdVar3[result_offset] = dVar1;
  }
  scan_state->position_in_entry = scan_state->position_in_entry + uVar6;
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}